

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O2

DdNode * Cudd_addResidue(DdManager *dd,int n,int m,int options,int top)

{
  int *piVar1;
  size_t __size;
  void *pvVar2;
  ulong *puVar3;
  long lVar4;
  int iVar5;
  void *pvVar6;
  void *__ptr;
  ulong uVar7;
  DdNode *pDVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  uint local_a4;
  void *local_98 [4];
  uint local_74;
  int local_70;
  int local_6c;
  void *local_68;
  ulong local_60;
  ulong local_58;
  DdNode *local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if (0 < n || 1 < m) {
    __size = (long)m * 8;
    pvVar6 = malloc(__size);
    if (pvVar6 != (void *)0x0) {
      local_98[0] = pvVar6;
      local_58 = (ulong)(uint)top;
      __ptr = malloc(__size);
      local_98[1] = __ptr;
      if (__ptr != (void *)0x0) {
        local_60 = (ulong)(uint)n;
        local_48 = (long)m;
        uVar7 = 0;
        uVar11 = 0;
        if (0 < m) {
          uVar11 = (ulong)(uint)m;
        }
        for (; uVar11 != uVar7; uVar7 = uVar7 + 1) {
          *(undefined8 *)((long)__ptr + uVar7 * 8) = 0;
          *(undefined8 *)((long)pvVar6 + uVar7 * 8) = 0;
        }
        uVar7 = 0;
        do {
          if (uVar11 == uVar7) {
            iVar5 = (int)local_60;
            local_70 = iVar5 + -1;
            uVar13 = 0;
            uVar7 = 0;
            if (0 < iVar5) {
              uVar7 = local_60 & 0xffffffff;
            }
            local_a4 = 1;
            local_68 = __ptr;
            local_98[3] = pvVar6;
            local_6c = (int)local_58 + iVar5;
            local_74 = (uint)uVar7;
            while( true ) {
              lVar4 = local_48;
              pvVar6 = local_98[3];
              uVar10 = (uint)uVar13;
              if (uVar10 == (uint)uVar7) {
                puVar3 = (ulong *)local_98[~(uint)local_60 & 1];
                for (lVar14 = 1; lVar14 < lVar4; lVar14 = lVar14 + 1) {
                  Cudd_RecursiveDeref(dd,(DdNode *)puVar3[lVar14]);
                }
                pDVar8 = (DdNode *)*puVar3;
                free(pvVar6);
                free(__ptr);
                piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + -1;
                return pDVar8;
              }
              uVar9 = uVar10 & 1;
              uVar12 = uVar9 ^ 1;
              iVar5 = uVar10 + (int)local_58;
              if ((options & 1U) != 0) {
                iVar5 = ~uVar10 + local_6c;
              }
              local_40 = uVar13;
              pDVar8 = cuddUniqueInter(dd,iVar5,dd->one,dd->zero);
              pvVar6 = local_98[3];
              if (pDVar8 == (DdNode *)0x0) break;
              local_50 = pDVar8;
              piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              local_38 = (ulong)local_a4;
              for (uVar7 = 0; __ptr = local_68, uVar11 != uVar7; uVar7 = uVar7 + 1) {
                pvVar2 = local_98[uVar12];
                pDVar8 = Cudd_addIte(dd,local_50,
                                     *(DdNode **)
                                      ((long)pvVar2 + (long)(((int)local_38 + (int)uVar7) % m) * 8),
                                     *(DdNode **)((long)pvVar2 + uVar7 * 8));
                if (pDVar8 == (DdNode *)0x0) {
                  for (uVar13 = 0; __ptr = local_68, pvVar6 = local_98[3], uVar7 != uVar13;
                      uVar13 = uVar13 + 1) {
                    Cudd_RecursiveDeref(dd,*(DdNode **)((long)local_98[uVar9] + uVar13 * 8));
                  }
                  for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                    Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + uVar7 * 8));
                  }
                  goto LAB_00605362;
                }
                piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + 1;
                *(DdNode **)((long)local_98[uVar9] + uVar7 * 8) = pDVar8;
              }
              for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
                Cudd_RecursiveDeref(dd,*(DdNode **)((long)local_98[uVar12] + uVar7 * 8));
              }
              Cudd_RecursiveDeref(dd,local_50);
              local_a4 = (int)(local_a4 * 2) % m;
              if (((int)local_40 == local_70 & (byte)options >> 1) == 1) {
                local_a4 = (int)(m - local_a4) % m;
              }
              uVar13 = (ulong)((int)local_40 + 1);
              uVar7 = (ulong)local_74;
            }
            for (uVar7 = 0; uVar11 != uVar7; uVar7 = uVar7 + 1) {
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)local_98[uVar12] + uVar7 * 8));
            }
LAB_00605362:
            free(pvVar6);
            free(__ptr);
            return (DdNode *)0x0;
          }
          pDVar8 = cuddUniqueConst(dd,(double)(int)uVar7);
          if (pDVar8 == (DdNode *)0x0) {
            for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
              Cudd_RecursiveDeref(dd,*(DdNode **)((long)__ptr + uVar11 * 8));
            }
            goto LAB_00605362;
          }
          piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          *(DdNode **)((long)__ptr + uVar7 * 8) = pDVar8;
          uVar7 = uVar7 + 1;
        } while( true );
      }
      free(pvVar6);
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_addResidue(
  DdManager * dd /* manager */,
  int  n /* number of bits */,
  int  m /* modulus */,
  int  options /* options */,
  int  top /* index of top variable */)
{
    int msbLsb; /* MSB on top (1) or LSB on top (0) */
    int tc;     /* two's complement (1) or unsigned (0) */
    int i, j, k, t, residue, thisOne, previous, index;
    DdNode **array[2], *var, *tmp, *res;

    /* Sanity check. */
    if (n < 1 && m < 2) return(NULL);

    msbLsb = options & CUDD_RESIDUE_MSB;
    tc = options & CUDD_RESIDUE_TC;

    /* Allocate and initialize working arrays. */
    array[0] = ABC_ALLOC(DdNode *,m);
    if (array[0] == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    array[1] = ABC_ALLOC(DdNode *,m);
    if (array[1] == NULL) {
        ABC_FREE(array[0]);
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < m; i++) {
        array[0][i] = array[1][i] = NULL;
    }

    /* Initialize residues. */
    for (i = 0; i < m; i++) {
        tmp = cuddUniqueConst(dd,(CUDD_VALUE_TYPE) i);
        if (tmp == NULL) {
            for (j = 0; j < i; j++) {
                Cudd_RecursiveDeref(dd,array[1][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(tmp);
        array[1][i] = tmp;
    }

    /* Main iteration. */
    residue = 1;        /* residue of 2**0 */
    for (k = 0; k < n; k++) {
        /* Choose current and previous arrays. */
        thisOne = k & 1;
        previous = thisOne ^ 1;
        /* Build an ADD projection function. */
        if (msbLsb) {
            index = top+n-k-1;
        } else {
            index = top+k;
        }
        var = cuddUniqueInter(dd,index,DD_ONE(dd),DD_ZERO(dd));
        if (var == NULL) {
            for (j = 0; j < m; j++) {
                Cudd_RecursiveDeref(dd,array[previous][j]);
            }
            ABC_FREE(array[0]);
            ABC_FREE(array[1]);
            return(NULL);
        }
        cuddRef(var);
        for (i = 0; i < m; i ++) {
            t = (i + residue) % m;
            tmp = Cudd_addIte(dd,var,array[previous][t],array[previous][i]);
            if (tmp == NULL) {
                for (j = 0; j < i; j++) {
                    Cudd_RecursiveDeref(dd,array[thisOne][j]);
                }
                for (j = 0; j < m; j++) {
                    Cudd_RecursiveDeref(dd,array[previous][j]);
                }
                ABC_FREE(array[0]);
                ABC_FREE(array[1]);
                return(NULL);
            }
            cuddRef(tmp);
            array[thisOne][i] = tmp;
        }
        /* One layer completed. Free the other array for the next iteration. */
        for (i = 0; i < m; i++) {
            Cudd_RecursiveDeref(dd,array[previous][i]);
        }
        Cudd_RecursiveDeref(dd,var);
        /* Update residue of 2**k. */
        residue = (2 * residue) % m;
        /* Adjust residue for MSB, if this is a two's complement number. */
        if (tc && (k == n - 1)) {
            residue = (m - residue) % m;
        }
    }

    /* We are only interested in the 0-residue node of the top layer. */
    for (i = 1; i < m; i++) {
        Cudd_RecursiveDeref(dd,array[(n - 1) & 1][i]);
    }
    res = array[(n - 1) & 1][0];

    ABC_FREE(array[0]);
    ABC_FREE(array[1]);

    cuddDeref(res);
    return(res);

}